

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DoSimpleFilter_SSE2(__m128i *p0,__m128i *q0,__m128i *fl)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i alVar12;
  undefined1 in_XMM2 [16];
  undefined1 auVar13 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar9 = paddsb(_DAT_00123c40,(undefined1  [16])*fl);
  auVar1 = paddsb((undefined1  [16])*fl,_DAT_00123c50);
  auVar19._0_14_ = in_XMM2._0_14_;
  auVar19[0xe] = in_XMM2[7];
  auVar19[0xf] = auVar1[7];
  auVar18._14_2_ = auVar19._14_2_;
  auVar18._0_13_ = in_XMM2._0_13_;
  auVar18[0xd] = auVar1[6];
  auVar17._13_3_ = auVar18._13_3_;
  auVar17._0_12_ = in_XMM2._0_12_;
  auVar17[0xc] = in_XMM2[6];
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_11_ = in_XMM2._0_11_;
  auVar16[0xb] = auVar1[5];
  auVar15._11_5_ = auVar16._11_5_;
  auVar15._0_10_ = in_XMM2._0_10_;
  auVar15[10] = in_XMM2[5];
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_9_ = in_XMM2._0_9_;
  auVar14[9] = auVar1[4];
  auVar13._9_7_ = auVar14._9_7_;
  auVar13._0_8_ = in_XMM2._0_8_;
  auVar13[8] = in_XMM2[4];
  auVar21._8_8_ = auVar13._8_8_;
  auVar21[7] = auVar1[3];
  auVar21[6] = in_XMM2[3];
  auVar21[5] = auVar1[2];
  auVar21[4] = in_XMM2[2];
  auVar21[3] = auVar1[1];
  auVar21[2] = in_XMM2[1];
  auVar21[0] = in_XMM2[0];
  auVar21[1] = auVar1[0];
  auVar11[1] = auVar1[8];
  auVar11[0] = auVar1[8];
  auVar11[2] = auVar1[9];
  auVar11[3] = auVar1[9];
  auVar11[4] = auVar1[10];
  auVar11[5] = auVar1[10];
  auVar11[6] = auVar1[0xb];
  auVar11[7] = auVar1[0xb];
  auVar11[8] = auVar1[0xc];
  auVar11[9] = auVar1[0xc];
  auVar11[10] = auVar1[0xd];
  auVar11[0xb] = auVar1[0xd];
  auVar11[0xc] = auVar1[0xe];
  auVar11[0xd] = auVar1[0xe];
  auVar11[0xf] = auVar1[0xf];
  auVar11[0xe] = auVar11[0xf];
  auVar20 = psraw(auVar21,0xb);
  auVar1 = psraw(auVar11,0xb);
  auVar21 = packsswb(auVar20,auVar1);
  auVar8._0_14_ = auVar1._0_14_;
  auVar8[0xe] = auVar1[7];
  auVar8[0xf] = auVar9[7];
  auVar7._14_2_ = auVar8._14_2_;
  auVar7._0_13_ = auVar1._0_13_;
  auVar7[0xd] = auVar9[6];
  auVar6._13_3_ = auVar7._13_3_;
  auVar6._0_12_ = auVar1._0_12_;
  auVar6[0xc] = auVar1[6];
  auVar5._12_4_ = auVar6._12_4_;
  auVar5._0_11_ = auVar1._0_11_;
  auVar5[0xb] = auVar9[5];
  auVar4._11_5_ = auVar5._11_5_;
  auVar4._0_10_ = auVar1._0_10_;
  auVar4[10] = auVar1[5];
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._0_9_ = auVar1._0_9_;
  auVar3[9] = auVar9[4];
  auVar2._9_7_ = auVar3._9_7_;
  auVar2._0_8_ = auVar1._0_8_;
  auVar2[8] = auVar1[4];
  auVar20._8_8_ = auVar2._8_8_;
  auVar20[7] = auVar9[3];
  auVar20[6] = auVar1[3];
  auVar20[5] = auVar9[2];
  auVar20[4] = auVar1[2];
  auVar20[3] = auVar9[1];
  auVar20[2] = auVar1[1];
  auVar20[0] = auVar1[0];
  auVar20[1] = auVar9[0];
  auVar10[1] = auVar9[8];
  auVar10[0] = auVar9[8];
  auVar10[2] = auVar9[9];
  auVar10[3] = auVar9[9];
  auVar10[4] = auVar9[10];
  auVar10[5] = auVar9[10];
  auVar10[6] = auVar9[0xb];
  auVar10[7] = auVar9[0xb];
  auVar10[8] = auVar9[0xc];
  auVar10[9] = auVar9[0xc];
  auVar10[10] = auVar9[0xd];
  auVar10[0xb] = auVar9[0xd];
  auVar10[0xc] = auVar9[0xe];
  auVar10[0xd] = auVar9[0xe];
  auVar10[0xf] = auVar9[0xf];
  auVar10[0xe] = auVar10[0xf];
  auVar1 = psraw(auVar20,0xb);
  auVar11 = psraw(auVar10,0xb);
  auVar1 = packsswb(auVar1,auVar11);
  alVar12 = (__m128i)psubsb((undefined1  [16])*q0,auVar21);
  *q0 = alVar12;
  alVar12 = (__m128i)paddsb(auVar1,(undefined1  [16])*p0);
  *p0 = alVar12;
  return;
}

Assistant:

static WEBP_INLINE void DoSimpleFilter_SSE2(__m128i* const p0,
                                            __m128i* const q0,
                                            const __m128i* const fl) {
  const __m128i k3 = _mm_set1_epi8(3);
  const __m128i k4 = _mm_set1_epi8(4);
  __m128i v3 = _mm_adds_epi8(*fl, k3);
  __m128i v4 = _mm_adds_epi8(*fl, k4);

  SignedShift8b_SSE2(&v4);             // v4 >> 3
  SignedShift8b_SSE2(&v3);             // v3 >> 3
  *q0 = _mm_subs_epi8(*q0, v4);        // q0 -= v4
  *p0 = _mm_adds_epi8(*p0, v3);        // p0 += v3
}